

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

void nullcThrowError(char *error,...)

{
  char local_428 [8];
  char buf [1024];
  va_list args;
  char *error_local;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    buf[0x3fc] = '0';
    buf[0x3fd] = '\0';
    buf[0x3fe] = '\0';
    buf[0x3ff] = '\0';
    buf[0x3f8] = '\b';
    buf[0x3f9] = '\0';
    buf[0x3fa] = '\0';
    buf[0x3fb] = '\0';
    if (error == (char *)0x0) {
      local_428[0] = '\0';
    }
    else {
      vsnprintf(local_428,0x400,error,buf + 0x3f8);
    }
    buf[0x3f7] = '\0';
    if (NULLC::currExec == 1) {
      ExecutorX86::Stop(NULLC::executorX86,local_428);
    }
    else if (NULLC::currExec == 0) {
      ExecutorRegVm::Stop(NULLC::executorRegVm,local_428);
    }
  }
  return;
}

Assistant:

void nullcThrowError(const char* error, ...)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED((void)0);

	va_list args;
	va_start(args, error);

	char buf[1024];

	if(error)
		vsnprintf(buf, 1024, error, args);
	else
		buf[0] = 0;
	buf[1024 - 1] = '\0';

	va_end(args);

	if(currExec == NULLC_X86)
	{
#ifdef NULLC_BUILD_X86_JIT
		executorX86->Stop(buf);
#endif
	}
	else if(currExec == NULLC_REG_VM)
	{
		executorRegVm->Stop(buf);
	}
	else if(currExec == NULLC_LLVM)
	{
#ifdef NULLC_LLVM_SUPPORT
		executorLLVM->Stop(buf);
#endif
	}
}